

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool __thiscall
pugi::xml_document::save_file
          (xml_document *this,char *path_,char_t *indent,uint flags,xml_encoding encoding)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  char *__modes;
  
  __modes = "w";
  if ((flags & 0x20) == 0) {
    __modes = "wb";
  }
  __stream = fopen(path_,__modes);
  bVar1 = impl::anon_unknown_0::save_file_impl(this,(FILE *)__stream,indent,flags,encoding);
  if (bVar1) {
    iVar2 = fclose(__stream);
    bVar1 = iVar2 == 0;
  }
  else {
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

PUGI_IMPL_FN bool xml_document::save_file(const char* path_, const char_t* indent, unsigned int flags, xml_encoding encoding) const
	{
		using impl::auto_deleter; // MSVC7 workaround
		auto_deleter<FILE> file(impl::open_file(path_, (flags & format_save_file_text) ? "w" : "wb"), impl::close_file);

		return impl::save_file_impl(*this, file.data, indent, flags, encoding) && fclose(file.release()) == 0;
	}